

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

QByteArray * __thiscall
QHttpNetworkRequest::uri
          (QByteArray *__return_storage_ptr__,QHttpNetworkRequest *this,bool throughProxy)

{
  long lVar1;
  QHttpNetworkRequestPrivate *pQVar2;
  qsizetype qVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QUrl copy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d).d.ptr;
  uVar4 = 0x1f00086;
  if (pQVar2->operation == Post) {
    uVar4 = (uint)(pQVar2->uploadByteDevice == (QNonContiguousByteDevice *)0x0) << 6 | 0x1f00086;
  }
  uVar5 = uVar4 | 0x1f;
  if (throughProxy) {
    uVar5 = uVar4;
  }
  copy.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&copy,&(pQVar2->super_QHttpNetworkHeaderPrivate).url);
  QUrl::path(&local_50,&copy,0x7f00000);
  qVar3 = local_50.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (qVar3 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_50.ptr = L"/";
    local_68.size = 0;
    local_50.size = 1;
    QUrl::setPath((QString *)&copy,(ParsingMode)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  else {
    uVar5 = uVar5 | 0x1000;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  QUrl::toEncoded(__return_storage_ptr__,&copy,uVar5);
  QUrl::~QUrl(&copy);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QHttpNetworkRequest::uri(bool throughProxy) const
{
    QUrl::FormattingOptions format(QUrl::RemoveFragment | QUrl::RemoveUserInfo | QUrl::FullyEncoded);

    // for POST, query data is sent as content
    if (d->operation == QHttpNetworkRequest::Post && !d->uploadByteDevice)
        format |= QUrl::RemoveQuery;
    // for requests through proxy, the Request-URI contains full url
    if (!throughProxy)
        format |= QUrl::RemoveScheme | QUrl::RemoveAuthority;
    QUrl copy = d->url;
    if (copy.path().isEmpty())
        copy.setPath(QStringLiteral("/"));
    else
        format |= QUrl::NormalizePathSegments;
    QByteArray uri = copy.toEncoded(format);
    return uri;
}